

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lin_alg.c
# Opt level: O2

void mat_inf_norm_cols(csc *M,c_float *E)

{
  double dVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  
  lVar4 = 0;
  lVar3 = M->n;
  if (M->n < 1) {
    lVar3 = lVar4;
  }
  for (; lVar3 != lVar4; lVar4 = lVar4 + 1) {
    E[lVar4] = 0.0;
  }
  lVar4 = 0;
  while (lVar5 = lVar4, lVar5 != lVar3) {
    lVar2 = M->p[lVar5 + 1];
    for (lVar6 = M->p[lVar5]; lVar4 = lVar5 + 1, lVar6 < lVar2; lVar6 = lVar6 + 1) {
      dVar1 = M->x[lVar6];
      dVar7 = -dVar1;
      if (-dVar1 <= dVar1) {
        dVar7 = dVar1;
      }
      if (dVar7 <= E[lVar5]) {
        dVar7 = E[lVar5];
      }
      E[lVar5] = dVar7;
    }
  }
  return;
}

Assistant:

void mat_inf_norm_cols(const csc *M, c_float *E) {
  c_int j, ptr;

  // Initialize zero max elements
  for (j = 0; j < M->n; j++) {
    E[j] = 0.;
  }

  // Compute maximum across columns
  for (j = 0; j < M->n; j++) {
    for (ptr = M->p[j]; ptr < M->p[j + 1]; ptr++) {
      E[j] = c_max(c_absval(M->x[ptr]), E[j]);
    }
  }
}